

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O1

exr_result_t
LossyDctEncoder_execute
          (_func_void_ptr_size_t *alloc_fn,_func_void_void_ptr *free_fn,LossyDctEncoder *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint16_t *puVar14;
  undefined4 *puVar15;
  undefined2 *puVar16;
  char cVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  int i;
  int iVar38;
  uint uVar39;
  uint uVar40;
  void *pvVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  int x;
  uint uVar46;
  long lVar47;
  ushort uVar48;
  uint uVar49;
  uint uVar50;
  long lVar51;
  int y;
  uint uVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  float fVar57;
  __m128 *srcVec;
  uint16_t *puVar58;
  bool bVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  DctCoderChannelData *chanData [3];
  uint16_t halfZigCoef [64];
  ulong local_168;
  long local_158 [3];
  void *local_140;
  uint64_t *local_138;
  float *local_130;
  uint16_t *local_128;
  _func_void_void_ptr *local_120;
  ulong local_118;
  ulong local_110;
  uint16_t *local_108;
  float *local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  uint16_t *local_d8;
  float *local_d0;
  long local_c8;
  ulong local_c0;
  undefined2 local_b8;
  uint16_t local_b6 [67];
  
  iVar44 = e->_width;
  iVar11 = e->_channel_encode_data_count;
  lVar54 = (long)iVar11;
  iVar12 = e->_height;
  local_120 = free_fn;
  fVar60 = ceilf((float)iVar44 * 0.125);
  fVar61 = ceilf((float)iVar12 * 0.125);
  puVar58 = (uint16_t *)e->_packedAc;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  if (lVar54 < 1) {
    iVar38 = 0;
  }
  else {
    memcpy(local_158,e->_channel_encode_data,lVar54 * 8);
    lVar45 = 0;
    iVar38 = 0;
    do {
      iVar43 = 0;
      if (e->_channel_encode_data[lVar45]->_type == EXR_PIXEL_FLOAT) {
        iVar43 = iVar12 * iVar44;
      }
      iVar38 = iVar38 + iVar43;
      lVar45 = lVar45 + 1;
    } while (lVar54 != lVar45);
  }
  if (iVar38 == 0) {
    pvVar41 = (void *)0x0;
  }
  else {
    pvVar41 = (*alloc_fn)((long)iVar38 * 2);
    if (pvVar41 == (void *)0x0) {
      return 1;
    }
  }
  local_140 = pvVar41;
  if (0 < iVar11) {
    lVar45 = 0;
    do {
      lVar56 = local_158[lVar45];
      if ((*(int *)(lVar56 + 0x1a0) == 2) && (iVar44 = e->_height, 0 < (long)iVar44)) {
        uVar39 = e->_width;
        lVar51 = 0;
        do {
          lVar53 = *(long *)(lVar56 + 0x188);
          if (0 < (int)uVar39) {
            lVar13 = *(long *)(lVar53 + lVar51 * 8);
            uVar55 = 0;
            do {
              fVar57 = *(float *)(lVar13 + uVar55 * 4);
              fVar62 = 65504.0;
              if ((fVar57 <= 65504.0) && (fVar62 = fVar57, fVar57 < -65504.0)) {
                fVar62 = -65504.0;
              }
              fVar57 = ABS(fVar62);
              uVar48 = (ushort)((uint)fVar62 >> 0x10) & 0x8000;
              if ((uint)fVar57 < 0x38800000) {
                if ((0x33000000 < (uint)fVar57) &&
                   (uVar40 = (uint)fVar62 & 0x7fffff | 0x800000,
                   cVar17 = (char)((uint)fVar57 >> 0x17),
                   uVar48 = uVar48 | (ushort)(uVar40 >> (0x7eU - cVar17 & 0x1f)),
                   0x80000000 < uVar40 << (cVar17 + 0xa2U & 0x1f))) {
                  uVar48 = uVar48 + 1;
                }
              }
              else if ((uint)fVar57 < 0x7f800000) {
                if ((uint)fVar57 < 0x477ff000) {
                  uVar48 = (ushort)((int)fVar57 + 0x8000fff + (uint)(((uint)fVar57 >> 0xd & 1) != 0)
                                   >> 0xd) | uVar48;
                }
                else {
                  uVar48 = uVar48 | 0x7c00;
                }
              }
              else {
                uVar48 = uVar48 | 0x7c00;
                if (fVar57 != INFINITY) {
                  uVar40 = (uint)fVar57 >> 0xd & 0x3ff;
                  uVar48 = uVar48 | (ushort)uVar40 | (ushort)(uVar40 == 0);
                }
              }
              *(ushort *)((long)pvVar41 + uVar55 * 2) = uVar48;
              uVar55 = uVar55 + 1;
            } while (uVar39 != uVar55);
          }
          *(void **)(lVar53 + lVar51 * 8) = pvVar41;
          pvVar41 = (void *)((long)pvVar41 + (long)(int)uVar39 * 2);
          lVar51 = lVar51 + 1;
        } while (lVar51 != iVar44);
      }
      lVar45 = lVar45 + 1;
    } while (lVar45 != lVar54);
  }
  uVar39 = (uint)fVar60;
  uVar40 = (uint)fVar61;
  local_f0 = local_158[0];
  *(uint8_t **)(local_158[0] + 0x180) = e->_packedDc;
  if (1 < iVar11) {
    lVar45 = 1;
    do {
      *(long *)(local_158[lVar45] + 0x180) =
           *(long *)(local_158[lVar45 + -1] + 0x180) + (long)(int)(uVar40 * uVar39) * 2;
      lVar45 = lVar45 + 1;
    } while (lVar54 != lVar45);
  }
  if (0 < (int)uVar40) {
    local_138 = &e->_numAcComp;
    local_100 = e->_quantTableY;
    local_108 = e->_hquantTableY;
    local_d0 = e->_quantTableCbCr;
    local_d8 = e->_hquantTableCbCr;
    local_118 = (ulong)uVar40;
    local_f8 = (ulong)uVar39;
    uVar55 = 0;
    do {
      local_110 = uVar55;
      if (0 < (int)uVar39) {
        local_e0 = local_158[1];
        local_e8 = local_158[2];
        local_c0 = (ulong)(uint)((int)uVar55 * 8);
        local_168 = 0;
        do {
          if (0 < iVar11) {
            uVar40 = (int)local_168 * 8;
            iVar44 = e->_width;
            iVar12 = e->_height;
            puVar14 = e->_toNonlinear;
            lVar45 = 0;
            do {
              lVar56 = local_158[lVar45];
              lVar51 = *(long *)(lVar56 + 0x188);
              lVar53 = 0;
              do {
                uVar42 = (int)local_c0 + (int)lVar53;
                uVar50 = ~uVar42 + iVar12 * 2;
                if ((int)uVar42 < iVar12) {
                  uVar50 = uVar42;
                }
                if ((int)uVar50 < 0) {
                  uVar50 = iVar12 - 1;
                }
                lVar13 = *(long *)(lVar51 + (long)(int)uVar50 * 8);
                lVar47 = 0;
                iVar38 = ~uVar40 + iVar44 * 2;
                do {
                  iVar43 = uVar40 + (int)lVar47;
                  if (iVar44 <= iVar43) {
                    iVar43 = iVar38;
                  }
                  if (iVar43 < 0) {
                    iVar43 = iVar44 + -1;
                  }
                  uVar48 = *(ushort *)(lVar13 + (long)iVar43 * 2);
                  if (puVar14 != (uint16_t *)0x0) {
                    uVar48 = puVar14[uVar48];
                  }
                  uVar42 = (uVar48 & 0x7fff) << 0xd;
                  uVar50 = (int)(short)uVar48 & 0x80000000;
                  if (uVar42 < 0x800000) {
                    if ((uVar48 & 0x7fff) != 0) {
                      uVar49 = 0x1f;
                      if ((uVar48 & 0x7fff) != 0) {
                        for (; uVar42 >> uVar49 == 0; uVar49 = uVar49 - 1) {
                        }
                      }
                      iVar43 = (uVar49 ^ 0x1f) - 8;
                      uVar50 = (uVar50 | uVar42 << ((byte)iVar43 & 0x1f) | 0x38800000) +
                               iVar43 * -0x800000;
                    }
                  }
                  else if (uVar42 < 0xf800000) {
                    uVar50 = (uVar50 | uVar42) + 0x38000000;
                  }
                  else {
                    uVar50 = uVar50 | uVar42 | 0x7f800000;
                  }
                  *(uint *)(lVar56 + lVar47 * 4) = uVar50;
                  lVar47 = lVar47 + 1;
                  iVar38 = iVar38 + -1;
                } while (lVar47 != 8);
                lVar53 = lVar53 + 1;
                lVar56 = lVar56 + 0x20;
              } while (lVar53 != 8);
              lVar45 = lVar45 + 1;
            } while (lVar45 != lVar54);
          }
          if (iVar11 == 3) {
            lVar45 = 0;
            do {
              fVar60 = *(float *)(local_f0 + lVar45 * 4);
              fVar61 = *(float *)(local_e0 + lVar45 * 4);
              fVar57 = *(float *)(local_e8 + lVar45 * 4);
              *(float *)(local_f0 + lVar45 * 4) =
                   fVar57 * 0.0722 + fVar60 * 0.2126 + fVar61 * 0.7152;
              *(float *)(local_e0 + lVar45 * 4) = fVar57 * 0.5 + fVar60 * -0.1146 + fVar61 * -0.3854
              ;
              *(float *)(local_e8 + lVar45 * 4) = fVar57 * -0.0458 + fVar60 * 0.5 + fVar61 * -0.4542
              ;
              lVar45 = lVar45 + 1;
            } while (lVar45 != 0x40);
          }
          if (0 < iVar11) {
            lVar45 = 0;
            local_128 = local_108;
            local_130 = local_100;
            do {
              local_c8 = lVar45;
              puVar15 = (undefined4 *)local_158[lVar45];
              iVar44 = 0;
              do {
                lVar45 = 0;
                do {
                  pfVar5 = (float *)((long)puVar15 + lVar45 + 0xe0);
                  pfVar1 = (float *)((long)puVar15 + lVar45);
                  pfVar2 = (float *)((long)puVar15 + lVar45 + 0x20);
                  pfVar3 = (float *)((long)puVar15 + lVar45 + 0x40);
                  pfVar4 = (float *)((long)puVar15 + lVar45 + 0x60);
                  fVar79 = *pfVar1 + *pfVar5;
                  fVar80 = pfVar1[1] + pfVar5[1];
                  fVar81 = pfVar1[2] + pfVar5[2];
                  fVar82 = pfVar1[3] + pfVar5[3];
                  fVar60 = *pfVar2 + *pfVar3;
                  fVar61 = pfVar2[1] + pfVar3[1];
                  fVar57 = pfVar2[2] + pfVar3[2];
                  fVar62 = pfVar2[3] + pfVar3[3];
                  pfVar6 = (float *)((long)puVar15 + lVar45 + 0x80);
                  fVar87 = *pfVar4 + *pfVar6;
                  fVar88 = pfVar4[1] + pfVar6[1];
                  fVar89 = pfVar4[2] + pfVar6[2];
                  fVar90 = pfVar4[3] + pfVar6[3];
                  pfVar7 = (float *)((long)puVar15 + lVar45 + 0xa0);
                  pfVar8 = (float *)((long)puVar15 + lVar45 + 0xc0);
                  fVar67 = *pfVar1 - *pfVar5;
                  fVar68 = pfVar1[1] - pfVar5[1];
                  fVar69 = pfVar1[2] - pfVar5[2];
                  fVar70 = pfVar1[3] - pfVar5[3];
                  fVar83 = *pfVar7 + *pfVar8;
                  fVar84 = pfVar7[1] + pfVar8[1];
                  fVar85 = pfVar7[2] + pfVar8[2];
                  fVar86 = pfVar7[3] + pfVar8[3];
                  fVar75 = *pfVar2 - *pfVar3;
                  fVar76 = pfVar2[1] - pfVar3[1];
                  fVar77 = pfVar2[2] - pfVar3[2];
                  fVar78 = pfVar2[3] - pfVar3[3];
                  fVar71 = *pfVar4 - *pfVar6;
                  fVar72 = pfVar4[1] - pfVar6[1];
                  fVar73 = pfVar4[2] - pfVar6[2];
                  fVar74 = pfVar4[3] - pfVar6[3];
                  fVar63 = *pfVar7 - *pfVar8;
                  fVar64 = pfVar7[1] - pfVar8[1];
                  fVar65 = pfVar7[2] - pfVar8[2];
                  fVar66 = pfVar7[3] - pfVar8[3];
                  fVar91 = (fVar79 + fVar87) * 0.70710677;
                  fVar92 = (fVar80 + fVar88) * 0.70710677;
                  fVar93 = (fVar81 + fVar89) * 0.70710677;
                  fVar94 = (fVar82 + fVar90) * 0.70710677;
                  fVar95 = (fVar60 + fVar83) * 0.70710677;
                  fVar96 = (fVar61 + fVar84) * 0.70710677;
                  fVar97 = (fVar57 + fVar85) * 0.70710677;
                  fVar98 = (fVar62 + fVar86) * 0.70710677;
                  pfVar1 = (float *)((long)puVar15 + lVar45);
                  *pfVar1 = (fVar91 + fVar95) * 0.5;
                  pfVar1[1] = (fVar92 + fVar96) * 0.5;
                  pfVar1[2] = (fVar93 + fVar97) * 0.5;
                  pfVar1[3] = (fVar94 + fVar98) * 0.5;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0x80);
                  *pfVar1 = (fVar91 - fVar95) * 0.5;
                  pfVar1[1] = (fVar92 - fVar96) * 0.5;
                  pfVar1[2] = (fVar93 - fVar97) * 0.5;
                  pfVar1[3] = (fVar94 - fVar98) * 0.5;
                  fVar91 = fVar75 - fVar63;
                  fVar92 = fVar76 - fVar64;
                  fVar93 = fVar77 - fVar65;
                  fVar94 = fVar78 - fVar66;
                  fVar79 = fVar79 - fVar87;
                  fVar80 = fVar80 - fVar88;
                  fVar81 = fVar81 - fVar89;
                  fVar82 = fVar82 - fVar90;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0x40);
                  *pfVar1 = fVar79 * 0.46193978 + fVar91 * 0.19134171;
                  pfVar1[1] = fVar80 * 0.46193978 + fVar92 * 0.19134171;
                  pfVar1[2] = fVar81 * 0.46193978 + fVar93 * 0.19134171;
                  pfVar1[3] = fVar82 * 0.46193978 + fVar94 * 0.19134171;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0xc0);
                  *pfVar1 = fVar79 * 0.19134171 - fVar91 * 0.46193978;
                  pfVar1[1] = fVar80 * 0.19134171 - fVar92 * 0.46193978;
                  pfVar1[2] = fVar81 * 0.19134171 - fVar93 * 0.46193978;
                  pfVar1[3] = fVar82 * 0.19134171 - fVar94 * 0.46193978;
                  fVar60 = (fVar60 - fVar83) * 0.70710677;
                  fVar61 = (fVar61 - fVar84) * 0.70710677;
                  fVar57 = (fVar57 - fVar85) * 0.70710677;
                  fVar62 = (fVar62 - fVar86) * 0.70710677;
                  fVar63 = (fVar63 + fVar75) * -0.70710677;
                  fVar64 = (fVar64 + fVar76) * -0.70710677;
                  fVar65 = (fVar65 + fVar77) * -0.70710677;
                  fVar66 = (fVar66 + fVar78) * -0.70710677;
                  fVar75 = fVar67 - fVar60;
                  fVar76 = fVar68 - fVar61;
                  fVar77 = fVar69 - fVar57;
                  fVar78 = fVar70 - fVar62;
                  fVar79 = fVar71 + fVar63;
                  fVar80 = fVar72 + fVar64;
                  fVar81 = fVar73 + fVar65;
                  fVar82 = fVar74 + fVar66;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0x60);
                  *pfVar1 = fVar75 * 0.4157348 - fVar79 * 0.27778512;
                  pfVar1[1] = fVar76 * 0.4157348 - fVar80 * 0.27778512;
                  pfVar1[2] = fVar77 * 0.4157348 - fVar81 * 0.27778512;
                  pfVar1[3] = fVar78 * 0.4157348 - fVar82 * 0.27778512;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0xa0);
                  *pfVar1 = fVar79 * 0.4157348 + fVar75 * 0.27778512;
                  pfVar1[1] = fVar80 * 0.4157348 + fVar76 * 0.27778512;
                  pfVar1[2] = fVar81 * 0.4157348 + fVar77 * 0.27778512;
                  pfVar1[3] = fVar82 * 0.4157348 + fVar78 * 0.27778512;
                  fVar60 = fVar60 + fVar67;
                  fVar61 = fVar61 + fVar68;
                  fVar57 = fVar57 + fVar69;
                  fVar62 = fVar62 + fVar70;
                  fVar63 = fVar63 - fVar71;
                  fVar64 = fVar64 - fVar72;
                  fVar65 = fVar65 - fVar73;
                  fVar66 = fVar66 - fVar74;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0x20);
                  *pfVar1 = fVar60 * 0.49039263 - fVar63 * 0.09754516;
                  pfVar1[1] = fVar61 * 0.49039263 - fVar64 * 0.09754516;
                  pfVar1[2] = fVar57 * 0.49039263 - fVar65 * 0.09754516;
                  pfVar1[3] = fVar62 * 0.49039263 - fVar66 * 0.09754516;
                  pfVar1 = (float *)((long)puVar15 + lVar45 + 0xe0);
                  *pfVar1 = fVar63 * 0.49039263 + fVar60 * 0.09754516;
                  pfVar1[1] = fVar64 * 0.49039263 + fVar61 * 0.09754516;
                  pfVar1[2] = fVar65 * 0.49039263 + fVar57 * 0.09754516;
                  pfVar1[3] = fVar66 * 0.49039263 + fVar62 * 0.09754516;
                  lVar45 = lVar45 + 0x10;
                } while (lVar45 == 0x10);
                uVar18 = puVar15[1];
                uVar19 = puVar15[2];
                uVar20 = puVar15[3];
                uVar21 = puVar15[0xb];
                uVar22 = puVar15[0x11];
                uVar23 = puVar15[0x13];
                uVar24 = puVar15[0x25];
                uVar25 = puVar15[0x26];
                uVar26 = puVar15[0x27];
                uVar27 = puVar15[0x2f];
                uVar28 = puVar15[0x35];
                uVar29 = puVar15[0x37];
                *puVar15 = *puVar15;
                puVar15[1] = puVar15[8];
                puVar15[2] = puVar15[0x10];
                puVar15[3] = puVar15[0x18];
                puVar15[0x10] = uVar19;
                puVar15[0x11] = puVar15[10];
                puVar15[0x12] = puVar15[0x12];
                puVar15[0x13] = puVar15[0x1a];
                puVar15[8] = uVar18;
                puVar15[9] = puVar15[9];
                puVar15[10] = uVar22;
                puVar15[0xb] = puVar15[0x19];
                puVar15[0x18] = uVar20;
                puVar15[0x19] = uVar21;
                puVar15[0x1a] = uVar23;
                puVar15[0x1b] = puVar15[0x1b];
                puVar15[0x24] = puVar15[0x24];
                puVar15[0x25] = puVar15[0x2c];
                puVar15[0x26] = puVar15[0x34];
                puVar15[0x27] = puVar15[0x3c];
                puVar15[0x34] = uVar25;
                puVar15[0x35] = puVar15[0x2e];
                puVar15[0x36] = puVar15[0x36];
                puVar15[0x37] = puVar15[0x3e];
                puVar15[0x2c] = uVar24;
                puVar15[0x2d] = puVar15[0x2d];
                puVar15[0x2e] = uVar28;
                puVar15[0x2f] = puVar15[0x3d];
                puVar15[0x3c] = uVar26;
                puVar15[0x3d] = uVar27;
                puVar15[0x3e] = uVar29;
                puVar15[0x3f] = puVar15[0x3f];
                uVar18 = puVar15[0x20];
                uVar19 = puVar15[0x21];
                uVar20 = puVar15[0x22];
                uVar21 = puVar15[0x23];
                uVar22 = puVar15[0x28];
                uVar23 = puVar15[0x29];
                uVar24 = puVar15[0x2a];
                uVar25 = puVar15[0x2b];
                uVar26 = puVar15[0x30];
                uVar27 = puVar15[0x31];
                uVar28 = puVar15[0x32];
                uVar29 = puVar15[0x33];
                uVar30 = puVar15[0x38];
                uVar31 = puVar15[0x39];
                uVar32 = puVar15[0x3a];
                uVar33 = puVar15[0x3b];
                puVar15[0x20] = puVar15[4];
                puVar15[0x21] = puVar15[0xc];
                puVar15[0x22] = puVar15[0x14];
                puVar15[0x23] = puVar15[0x1c];
                puVar15[0x30] = puVar15[6];
                puVar15[0x31] = puVar15[0xe];
                puVar15[0x32] = puVar15[0x16];
                puVar15[0x33] = puVar15[0x1e];
                puVar15[0x28] = puVar15[5];
                puVar15[0x29] = puVar15[0xd];
                puVar15[0x2a] = puVar15[0x15];
                puVar15[0x2b] = puVar15[0x1d];
                puVar15[0x38] = puVar15[7];
                puVar15[0x39] = puVar15[0xf];
                puVar15[0x3a] = puVar15[0x17];
                puVar15[0x3b] = puVar15[0x1f];
                puVar15[4] = uVar18;
                puVar15[5] = uVar22;
                puVar15[6] = uVar26;
                puVar15[7] = uVar30;
                puVar15[0x14] = uVar20;
                puVar15[0x15] = uVar24;
                puVar15[0x16] = uVar28;
                puVar15[0x17] = uVar32;
                puVar15[0xc] = uVar19;
                puVar15[0xd] = uVar23;
                puVar15[0xe] = uVar27;
                puVar15[0xf] = uVar31;
                puVar15[0x1c] = uVar21;
                puVar15[0x1d] = uVar25;
                puVar15[0x1e] = uVar29;
                puVar15[0x1f] = uVar33;
                bVar59 = iVar44 == 0;
                iVar44 = iVar44 + 1;
              } while (bVar59);
              uVar55 = 0xfffffffffffffffc;
              do {
                uVar40 = puVar15[uVar55 + 4];
                uVar42 = uVar40 & 0x7fffffff;
                uVar50 = uVar40 >> 0x10 & 0x8000;
                if (uVar42 < 0x38800000) {
                  if ((0x33000000 < uVar42) &&
                     (uVar40 = uVar40 & 0x7fffff | 0x800000, cVar17 = (char)(uVar42 >> 0x17),
                     uVar50 = uVar50 | uVar40 >> (0x7eU - cVar17 & 0x1f),
                     0x80000000 < uVar40 << (cVar17 + 0xa2U & 0x1f))) {
                    uVar50 = uVar50 + 1;
                  }
                }
                else if (uVar42 < 0x7f800000) {
                  if (uVar42 < 0x477ff000) {
                    uVar50 = uVar42 + 0x8000fff + (uint)((uVar42 >> 0xd & 1) != 0) >> 0xd | uVar50;
                  }
                  else {
                    uVar50 = uVar50 | 0x7c00;
                  }
                }
                else {
                  uVar50 = uVar50 | 0x7c00;
                  if (uVar42 != 0x7f800000) {
                    uVar40 = uVar42 >> 0xd & 0x3ff;
                    uVar50 = uVar50 | uVar40 | (uint)(uVar40 == 0);
                  }
                }
                uVar40 = puVar15[uVar55 + 5];
                uVar42 = uVar40 & 0x7fffffff;
                uVar49 = uVar40 >> 0x10 & 0x8000;
                if (uVar42 < 0x38800000) {
                  if ((0x33000000 < uVar42) &&
                     (uVar40 = uVar40 & 0x7fffff | 0x800000, cVar17 = (char)(uVar42 >> 0x17),
                     uVar49 = uVar49 | uVar40 >> (0x7eU - cVar17 & 0x1f),
                     0x80000000 < uVar40 << (cVar17 + 0xa2U & 0x1f))) {
                    uVar49 = uVar49 + 1;
                  }
                }
                else if (uVar42 < 0x7f800000) {
                  if (uVar42 < 0x477ff000) {
                    uVar49 = uVar42 + 0x8000fff + (uint)((uVar42 >> 0xd & 1) != 0) >> 0xd | uVar49;
                  }
                  else {
                    uVar49 = uVar49 | 0x7c00;
                  }
                }
                else {
                  uVar49 = uVar49 | 0x7c00;
                  if (uVar42 != 0x7f800000) {
                    uVar40 = uVar42 >> 0xd & 0x3ff;
                    uVar49 = uVar49 | uVar40 | (uint)(uVar40 == 0);
                  }
                }
                uVar40 = puVar15[uVar55 + 6];
                uVar42 = uVar40 & 0x7fffffff;
                uVar52 = uVar40 >> 0x10 & 0x8000;
                if (uVar42 < 0x38800000) {
                  if ((0x33000000 < uVar42) &&
                     (uVar40 = uVar40 & 0x7fffff | 0x800000, cVar17 = (char)(uVar42 >> 0x17),
                     uVar52 = uVar52 | uVar40 >> (0x7eU - cVar17 & 0x1f),
                     0x80000000 < uVar40 << (cVar17 + 0xa2U & 0x1f))) {
                    uVar52 = uVar52 + 1;
                  }
                }
                else if (uVar42 < 0x7f800000) {
                  if (uVar42 < 0x477ff000) {
                    uVar52 = uVar42 + 0x8000fff + (uint)((uVar42 >> 0xd & 1) != 0) >> 0xd | uVar52;
                  }
                  else {
                    uVar52 = uVar52 | 0x7c00;
                  }
                }
                else {
                  uVar52 = uVar52 | 0x7c00;
                  if (uVar42 != 0x7f800000) {
                    uVar40 = uVar42 >> 0xd & 0x3ff;
                    uVar52 = uVar52 | uVar40 | (uint)(uVar40 == 0);
                  }
                }
                uVar40 = puVar15[uVar55 + 7];
                uVar42 = uVar40 & 0x7fffffff;
                uVar46 = uVar40 >> 0x10 & 0x8000;
                if (uVar42 < 0x38800000) {
                  if ((0x33000000 < uVar42) &&
                     (uVar40 = uVar40 & 0x7fffff | 0x800000, cVar17 = (char)(uVar42 >> 0x17),
                     uVar46 = uVar46 | uVar40 >> (0x7eU - cVar17 & 0x1f),
                     0x80000000 < uVar40 << (cVar17 + 0xa2U & 0x1f))) {
                    uVar46 = uVar46 + 1;
                  }
                }
                else if (uVar42 < 0x7f800000) {
                  if (uVar42 < 0x477ff000) {
                    uVar46 = uVar42 + 0x8000fff + (uint)((uVar42 >> 0xd & 1) != 0) >> 0xd | uVar46;
                  }
                  else {
                    uVar46 = uVar46 | 0x7c00;
                  }
                }
                else {
                  uVar46 = uVar46 | 0x7c00;
                  if (uVar42 != 0x7f800000) {
                    uVar40 = uVar42 >> 0xd & 0x3ff;
                    uVar46 = uVar46 | uVar40 | (uint)(uVar40 == 0);
                  }
                }
                fVar60 = local_130[uVar55 + 5];
                fVar61 = local_130[uVar55 + 6];
                fVar57 = local_130[uVar55 + 7];
                uVar48 = local_128[uVar55 + 5];
                uVar9 = local_128[uVar55 + 6];
                uVar10 = local_128[uVar55 + 7];
                uVar40 = (uVar50 & 0x7fff) << 0xd;
                fVar62 = (float)((int)(short)uVar50 & 0x80000000);
                if (uVar40 < 0x800000) {
                  if ((uVar50 & 0x7fff) != 0) {
                    uVar42 = 0x1f;
                    if ((uVar50 & 0x7fff) != 0) {
                      for (; uVar40 >> uVar42 == 0; uVar42 = uVar42 - 1) {
                      }
                    }
                    iVar44 = (uVar42 ^ 0x1f) - 8;
                    fVar62 = (float)(((uint)fVar62 | uVar40 << ((byte)iVar44 & 0x1f) | 0x38800000) +
                                    iVar44 * -0x800000);
                  }
                }
                else if (uVar40 < 0xf800000) {
                  fVar62 = (float)(((uint)fVar62 | uVar40) + 0x38000000);
                }
                else {
                  fVar62 = (float)((uint)fVar62 | uVar40 | 0x7f800000);
                }
                uVar34 = algoQuantize(uVar50 & 0xffff,(uint)local_128[uVar55 + 4],
                                      local_130[uVar55 + 4],fVar62);
                uVar40 = (uVar49 & 0x7fff) << 0xd;
                fVar62 = (float)((int)(short)uVar49 & 0x80000000);
                if (uVar40 < 0x800000) {
                  if ((uVar49 & 0x7fff) != 0) {
                    uVar50 = 0x1f;
                    if ((uVar49 & 0x7fff) != 0) {
                      for (; uVar40 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                      }
                    }
                    iVar44 = (uVar50 ^ 0x1f) - 8;
                    fVar62 = (float)(((uint)fVar62 | uVar40 << ((byte)iVar44 & 0x1f) | 0x38800000) +
                                    iVar44 * -0x800000);
                  }
                }
                else if (uVar40 < 0xf800000) {
                  fVar62 = (float)(((uint)fVar62 | uVar40) + 0x38000000);
                }
                else {
                  fVar62 = (float)((uint)fVar62 | uVar40 | 0x7f800000);
                }
                uVar35 = algoQuantize(uVar49 & 0xffff,(uint)uVar48,fVar60,fVar62);
                uVar40 = (uVar52 & 0x7fff) << 0xd;
                fVar60 = (float)((int)(short)uVar52 & 0x80000000);
                if (uVar40 < 0x800000) {
                  if ((uVar52 & 0x7fff) != 0) {
                    uVar50 = 0x1f;
                    if ((uVar52 & 0x7fff) != 0) {
                      for (; uVar40 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                      }
                    }
                    iVar44 = (uVar50 ^ 0x1f) - 8;
                    fVar60 = (float)(((uint)fVar60 | uVar40 << ((byte)iVar44 & 0x1f) | 0x38800000) +
                                    iVar44 * -0x800000);
                  }
                }
                else if (uVar40 < 0xf800000) {
                  fVar60 = (float)(((uint)fVar60 | uVar40) + 0x38000000);
                }
                else {
                  fVar60 = (float)((uint)fVar60 | uVar40 | 0x7f800000);
                }
                uVar36 = algoQuantize(uVar52 & 0xffff,(uint)uVar9,fVar61,fVar60);
                uVar40 = (uVar46 & 0x7fff) << 0xd;
                fVar60 = (float)((int)(short)uVar46 & 0x80000000);
                if (uVar40 < 0x800000) {
                  if ((uVar46 & 0x7fff) != 0) {
                    uVar50 = 0x1f;
                    if ((uVar46 & 0x7fff) != 0) {
                      for (; uVar40 >> uVar50 == 0; uVar50 = uVar50 - 1) {
                      }
                    }
                    iVar44 = (uVar50 ^ 0x1f) - 8;
                    fVar60 = (float)(((uint)fVar60 | uVar40 << ((byte)iVar44 & 0x1f) | 0x38800000) +
                                    iVar44 * -0x800000);
                  }
                }
                else if (uVar40 < 0xf800000) {
                  fVar60 = (float)(((uint)fVar60 | uVar40) + 0x38000000);
                }
                else {
                  fVar60 = (float)((uint)fVar60 | uVar40 | 0x7f800000);
                }
                uVar37 = algoQuantize(uVar46 & 0xffff,(uint)uVar10,fVar57,fVar60);
                local_b6[(long)*(int *)(&UNK_00196890 + uVar55 * 4) + -1] = uVar34;
                local_b6[(long)*(int *)(&UNK_00196894 + uVar55 * 4) + -1] = uVar35;
                local_b6[(long)*(int *)(&UNK_00196898 + uVar55 * 4) + -1] = uVar36;
                local_b6[(long)*(int *)(&UNK_0019689c + uVar55 * 4) + -1] = uVar37;
                uVar55 = uVar55 + 4;
              } while (uVar55 < 0x3c);
              puVar16 = *(undefined2 **)(puVar15 + 0x60);
              *(undefined2 **)(puVar15 + 0x60) = puVar16 + 1;
              *puVar16 = local_b8;
              e->_numDcComp = e->_numDcComp + 1;
              uVar40 = 1;
              do {
                if (local_b6[(ulong)uVar40 - 1] == 0) {
                  uVar50 = uVar40 + 1;
                  uVar48 = 1;
                  if (uVar40 < 0x3f) {
                    uVar48 = 1;
                    do {
                      if (local_b6[(long)(int)uVar50 + -1] != 0) break;
                      uVar48 = uVar48 + 1;
                      uVar50 = uVar48 + uVar40;
                    } while (uVar50 < 0x40);
                  }
                  uVar34 = uVar48 | 0xff00;
                  if (uVar50 == 0x40) {
                    uVar34 = 0xff00;
                  }
                  uVar35 = 0;
                  if (uVar48 != 1) {
                    uVar35 = uVar34;
                  }
                  *puVar58 = uVar35;
                  *local_138 = *local_138 + 1;
                  uVar50 = (uint)uVar48;
                }
                else {
                  *puVar58 = local_b6[(ulong)uVar40 - 1];
                  *local_138 = *local_138 + 1;
                  uVar50 = 1;
                }
                uVar40 = uVar40 + uVar50;
                puVar58 = puVar58 + 1;
              } while (uVar40 < 0x40);
              lVar45 = local_c8 + 1;
              local_128 = local_d8;
              local_130 = local_d0;
            } while (lVar45 != lVar54);
          }
          local_168 = local_168 + 1;
        } while (local_168 != local_f8);
      }
      uVar55 = local_110 + 1;
    } while (uVar55 != local_118);
  }
  if (local_140 != (void *)0x0) {
    (*local_120)(local_140);
  }
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (
    void* (*alloc_fn) (size_t), void (*free_fn) (void*), LossyDctEncoder* e)
{
    int                  numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) (ceilf ((float) e->_width / 8.0f));
    int numBlocksY = (int) (ceilf ((float) e->_height / 8.0f));

    uint16_t halfZigCoef[64];

    uint16_t* currAcComp            = (uint16_t*) e->_packedAc;
    int       tmpHalfBufferElements = 0;
    uint16_t* tmpHalfBuffer         = NULL;
    uint16_t* tmpHalfBufferPtr      = NULL;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) alloc_fn (
            (size_t) tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (int chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t              h;
            const float* restrict quantTable;
            const uint16_t* restrict hquantTable;

            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            quantTable = e->_quantTableY;
            hquantTable = e->_hquantTableY;
            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, zigzag, and convert to XDR
                //
                quantizeCoeffAndZigXDR (halfZigCoef, chanData[chan]->_dctData,
                                        quantTable, hquantTable);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
                hquantTable = e->_hquantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) free_fn (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}